

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O2

void prometheus::anon_unknown_3::WriteValue(ostream *out,string *value)

{
  pointer pcVar1;
  size_type sVar2;
  ostream *poVar3;
  char cVar4;
  size_type sVar5;
  
  pcVar1 = (value->_M_dataplus)._M_p;
  sVar2 = value->_M_string_length;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    cVar4 = pcVar1[sVar5];
    if (cVar4 == '\\') {
      poVar3 = ::std::operator<<(out,'\\');
      cVar4 = '\\';
    }
    else if (cVar4 == '\"') {
      poVar3 = ::std::operator<<(out,'\\');
      cVar4 = '\"';
    }
    else {
      poVar3 = out;
      if (cVar4 == '\n') {
        poVar3 = ::std::operator<<(out,'\\');
        cVar4 = 'n';
      }
    }
    ::std::operator<<(poVar3,cVar4);
  }
  return;
}

Assistant:

void WriteValue(std::ostream& out, const std::string& value) {
  for (auto c : value) {
    switch (c) {
      case '\n':
        out << '\\' << 'n';
        break;

      case '\\':
        out << '\\' << c;
        break;

      case '"':
        out << '\\' << c;
        break;

      default:
        out << c;
        break;
    }
  }
}